

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void __thiscall lest::got::got(got *this,location *where_,text *expr_,text *excpt_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  text local_b8;
  text local_98;
  text local_78;
  location local_58;
  
  std::operator+(&local_f8,"passed: got exception ",excpt_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
    local_b8.field_2._8_4_ = local_f8.field_2._8_4_;
    local_b8.field_2._12_4_ = local_f8.field_2._12_4_;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
  }
  local_b8.field_2._M_allocated_capacity._4_4_ = local_f8.field_2._M_allocated_capacity._4_4_;
  local_b8.field_2._M_allocated_capacity._0_4_ = local_f8.field_2._M_allocated_capacity._0_4_;
  local_b8._M_string_length = local_f8._M_string_length;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity._0_4_ =
       local_f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &local_58.file.field_2;
  pcVar2 = (where_->file)._M_dataplus._M_p;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (where_->file)._M_string_length);
  local_58.line = where_->line;
  pcVar2 = (expr_->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + expr_->_M_string_length);
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  if (local_d8 == &local_c8) {
    local_98.field_2._8_8_ = local_c8._8_8_;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_d8;
  }
  local_98.field_2._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
  local_98.field_2._M_local_buf[0] = local_c8._M_local_buf[0];
  local_98._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_d8 = &local_c8;
  success::success(&this->super_success,&local_b8,&local_58,&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0])
                             + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT44(local_f8.field_2._M_allocated_capacity._4_4_,
                             local_f8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  *(undefined ***)&(this->super_success).super_message = &PTR__message_001fed38;
  return;
}

Assistant:

got( location where_, text expr_, text excpt_)
    : success( "passed: got exception " + excpt_, where_, expr_) {}